

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

void __thiscall
duckdb::WindowGlobalSinkState::WindowGlobalSinkState
          (WindowGlobalSinkState *this,PhysicalWindow *op,ClientContext *context)

{
  WindowSharedExpressions *shared;
  _Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false> _Var1;
  const_reference pvVar2;
  pointer pEVar3;
  DBConfig *pDVar4;
  BoundWindowExpression *wexpr;
  WindowRowNumberExecutor *this_00;
  _Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false> this_01;
  InternalException *this_02;
  ExpressionType type;
  size_type __n;
  _Head_base<0UL,_duckdb::WindowExecutor_*,_false> local_a0;
  WindowAggregationMode local_94;
  unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
  *local_90;
  vector<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>>
  *local_88;
  BoundWindowExpression *local_80;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_78;
  string local_70;
  string local_50;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__WindowGlobalSinkState_02456de8;
  this->op = op;
  this->context = context;
  local_90 = &this->global_partition;
  local_88 = (vector<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>>
              *)&this->executors;
  shared = &this->shared;
  (this->global_partition).
  super_unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  .super__Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false>._M_head_impl =
       (WindowPartitionGlobalSinkState *)0x0;
  (this->executors).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->executors).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->executors).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shared).coll_shared.size = 0;
  (this->shared).coll_shared.columns._M_h._M_buckets =
       &(this->shared).coll_shared.columns._M_h._M_single_bucket;
  (this->shared).coll_shared.columns._M_h._M_bucket_count = 1;
  (this->shared).coll_shared.columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shared).coll_shared.columns._M_h._M_element_count = 0;
  (this->shared).coll_shared.columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shared).coll_shared.columns._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shared).coll_shared.columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shared).sink_shared.size = 0;
  (this->shared).sink_shared.columns._M_h._M_buckets =
       &(this->shared).sink_shared.columns._M_h._M_single_bucket;
  (this->shared).sink_shared.columns._M_h._M_bucket_count = 1;
  (this->shared).sink_shared.columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shared).sink_shared.columns._M_h._M_element_count = 0;
  (this->shared).sink_shared.columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shared).sink_shared.columns._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shared).sink_shared.columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shared).eval_shared.size = 0;
  (this->shared).eval_shared.columns._M_h._M_buckets =
       &(this->shared).eval_shared.columns._M_h._M_single_bucket;
  (this->shared).eval_shared.columns._M_h._M_bucket_count = 1;
  (this->shared).eval_shared.columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shared).eval_shared.columns._M_h._M_element_count = 0;
  (this->shared).eval_shared.columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shared).eval_shared.columns._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shared).eval_shared.columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shared).coll_validity._M_h._M_buckets = &(this->shared).coll_validity._M_h._M_single_bucket
  ;
  (this->shared).coll_validity._M_h._M_bucket_count = 1;
  (this->shared).coll_validity._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shared).coll_validity._M_h._M_element_count = 0;
  (this->shared).coll_validity._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shared).coll_validity._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shared).coll_validity._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = &op->select_list;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](local_78,op->order_idx);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  local_80 = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar3->super_BaseExpression);
  pDVar4 = DBConfig::GetConfig(context);
  if ((op->select_list).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (op->select_list).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_94 = (pDVar4->options).window_mode;
    __n = 0;
    do {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](local_78,__n);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      wexpr = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar3->super_BaseExpression);
      switch((wexpr->super_Expression).super_BaseExpression.type) {
      case WINDOW_AGGREGATE:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x50);
        WindowAggregateExecutor::WindowAggregateExecutor
                  ((WindowAggregateExecutor *)this_00,wexpr,context,shared,local_94);
        break;
      default:
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Window aggregate type %s","");
        ExpressionTypeToString_abi_cxx11_
                  (&local_50,(duckdb *)(ulong)(wexpr->super_Expression).super_BaseExpression.type,
                   type);
        InternalException::InternalException<std::__cxx11::string>(this_02,&local_70,&local_50);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case WINDOW_RANK:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x50);
        WindowRankExecutor::WindowRankExecutor((WindowRankExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_RANK_DENSE:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x50);
        WindowDenseRankExecutor::WindowDenseRankExecutor
                  ((WindowDenseRankExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_NTILE:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x58);
        WindowNtileExecutor::WindowNtileExecutor
                  ((WindowNtileExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_PERCENT_RANK:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x50);
        WindowPercentRankExecutor::WindowPercentRankExecutor
                  ((WindowPercentRankExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_CUME_DIST:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x50);
        WindowCumeDistExecutor::WindowCumeDistExecutor
                  ((WindowCumeDistExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_ROW_NUMBER:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x58);
        WindowRowNumberExecutor::WindowRowNumberExecutor(this_00,wexpr,context,shared);
        break;
      case WINDOW_FIRST_VALUE:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x70);
        WindowFirstValueExecutor::WindowFirstValueExecutor
                  ((WindowFirstValueExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_LAST_VALUE:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x70);
        WindowLastValueExecutor::WindowLastValueExecutor
                  ((WindowLastValueExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_LEAD:
      case WINDOW_LAG:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x70);
        WindowLeadLagExecutor::WindowLeadLagExecutor
                  ((WindowLeadLagExecutor *)this_00,wexpr,context,shared);
        break;
      case WINDOW_NTH_VALUE:
        this_00 = (WindowRowNumberExecutor *)operator_new(0x70);
        WindowNthValueExecutor::WindowNthValueExecutor
                  ((WindowNthValueExecutor *)this_00,wexpr,context,shared);
      }
      local_a0._M_head_impl = &this_00->super_WindowExecutor;
      ::std::
      vector<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::WindowExecutor,std::default_delete<duckdb::WindowExecutor>,true>>
                (local_88,(unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                           *)&local_a0);
      if ((WindowRowNumberExecutor *)local_a0._M_head_impl != (WindowRowNumberExecutor *)0x0) {
        (*(((WindowValueExecutor *)&(local_a0._M_head_impl)->_vptr_WindowExecutor)->
          super_WindowExecutor)._vptr_WindowExecutor[1])();
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(op->select_list).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(op->select_list).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_01._M_head_impl = (WindowPartitionGlobalSinkState *)operator_new(0x130);
  WindowPartitionGlobalSinkState::WindowPartitionGlobalSinkState(this_01._M_head_impl,this,local_80)
  ;
  _Var1._M_head_impl =
       (local_90->
       super_unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false>._M_head_impl;
  (local_90->
  super_unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>_>
  .super__Head_base<0UL,_duckdb::WindowPartitionGlobalSinkState_*,_false>._M_head_impl =
       this_01._M_head_impl;
  if (_Var1._M_head_impl != (WindowPartitionGlobalSinkState *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_PartitionGlobalSinkState + 8))();
  }
  return;
}

Assistant:

WindowGlobalSinkState::WindowGlobalSinkState(const PhysicalWindow &op, ClientContext &context)
    : op(op), context(context) {

	D_ASSERT(op.select_list[op.order_idx]->GetExpressionClass() == ExpressionClass::BOUND_WINDOW);
	auto &wexpr = op.select_list[op.order_idx]->Cast<BoundWindowExpression>();

	const auto mode = DBConfig::GetConfig(context).options.window_mode;
	for (idx_t expr_idx = 0; expr_idx < op.select_list.size(); ++expr_idx) {
		D_ASSERT(op.select_list[expr_idx]->GetExpressionClass() == ExpressionClass::BOUND_WINDOW);
		auto &wexpr = op.select_list[expr_idx]->Cast<BoundWindowExpression>();
		auto wexec = WindowExecutorFactory(wexpr, context, shared, mode);
		executors.emplace_back(std::move(wexec));
	}

	global_partition = make_uniq<WindowPartitionGlobalSinkState>(*this, wexpr);
}